

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::Test::RecordProperty(string *key,int value)

{
  allocator<char> local_61;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string local_58;
  string local_38;
  
  Message::Message((Message *)&local_60);
  std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),value);
  internal::StringStreamToString(&local_58,local_60._M_head_impl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,local_58._M_dataplus._M_p,&local_61);
  UnitTest::GetInstance();
  UnitTest::RecordProperty(&UnitTest::GetInstance::instance,key,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_60._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}